

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O0

int Curl_str_until(char **linep,Curl_str *out,size_t max,char delim)

{
  bool bVar1;
  ulong local_40;
  size_t len;
  char *s;
  char delim_local;
  size_t max_local;
  Curl_str *out_local;
  char **linep_local;
  
  len = (size_t)*linep;
  local_40 = 0;
  Curl_str_init(out);
  while( true ) {
    bVar1 = false;
    if (*(char *)len != '\0') {
      bVar1 = *(char *)len != delim;
    }
    if (!bVar1) break;
    len = len + 1;
    local_40 = local_40 + 1;
    if (max < local_40) {
      return 1;
    }
  }
  if (local_40 == 0) {
    return 2;
  }
  out->str = *linep;
  out->len = local_40;
  *linep = (char *)len;
  return 0;
}

Assistant:

int Curl_str_until(const char **linep, struct Curl_str *out,
                   const size_t max, char delim)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max && delim);

  Curl_str_init(out);
  while(*s && (*s != delim)) {
    s++;
    if(++len > max) {
      return STRE_BIG;
    }
  }
  if(!len)
    return STRE_SHORT;
  out->str = *linep;
  out->len = len;
  *linep = s; /* point to the first byte after the word */
  return STRE_OK;
}